

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaL_typerror(lua_State *L,int narg,char *tname)

{
  TValue *pTVar1;
  char *pcVar2;
  
  pTVar1 = index2adr(L,narg);
  pcVar2 = "no value";
  if ((pTVar1 != &luaO_nilobject_) && ((long)pTVar1->tt != -1)) {
    pcVar2 = luaT_typenames[pTVar1->tt];
  }
  pcVar2 = lua_pushfstring(L,"%s expected, got %s",tname,pcVar2);
  luaL_argerror(L,narg,pcVar2);
}

Assistant:

static int luaL_typerror(lua_State*L,int narg,const char*tname){
const char*msg=lua_pushfstring(L,"%s expected, got %s",
tname,luaL_typename(L,narg));
return luaL_argerror(L,narg,msg);
}